

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseVisitor.hpp
# Opt level: O0

void __thiscall OpenMD::BaseVisitor::~BaseVisitor(BaseVisitor *this)

{
  void *in_RDI;
  
  ~BaseVisitor((BaseVisitor *)0x129ef8);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

virtual ~BaseVisitor() {}